

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IM483I.h
# Opt level: O3

int ConnectIM483I(IM483I *pIM483I,char *szCfgFilePath)

{
  int iVar1;
  uint uVar2;
  FILE *__stream;
  char *pcVar3;
  size_t sVar4;
  ulong uVar5;
  ssize_t sVar6;
  int iVar7;
  void *__buf;
  char line [256];
  char recvbuf [512];
  byte local_5a8;
  char local_5a7;
  int *local_4a0;
  BOOL *local_498;
  int *local_490;
  BOOL *local_488;
  int *local_480;
  int *local_478;
  int *local_470;
  int *local_468;
  int *local_460;
  int *local_458;
  int *local_450;
  double *local_448;
  undefined8 local_440;
  timespec local_438 [32];
  uint8 local_238 [520];
  
  memset(pIM483I->szCfgFilePath,0,0x100);
  sprintf(pIM483I->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar1 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar1 != 0) {
    memset(&local_5a8,0,0x100);
    memset(pIM483I->szDevPath + 5,0,0xfb);
    builtin_strncpy(pIM483I->szDevPath,"COM1",5);
    pIM483I->BaudRate = 0x12c0;
    pIM483I->timeout = 1000;
    pIM483I->threadperiod = 0x32;
    pIM483I->bSaveRawData = 1;
    pIM483I->bytedelayus = -1;
    pIM483I->bCheckState = 0;
    pIM483I->CalibrationSpeed = 2000;
    pIM483I->CalibrationTime = 65000;
    pIM483I->CalibrationHoldTorque = 1;
    pIM483I->CalibrationRunTorque = 0x3c;
    pIM483I->NormalHoldTorque = 1;
    pIM483I->NormalRunTorque = 100;
    pIM483I->ThresholdRval = 0;
    *(undefined4 *)&pIM483I->MinAngle = 0;
    *(undefined4 *)((long)&pIM483I->MinAngle + 4) = 0;
    *(undefined4 *)&pIM483I->MaxAngle = 0x54442d18;
    *(undefined4 *)((long)&pIM483I->MaxAngle + 4) = 0x3ff921fb;
    __stream = fopen(szCfgFilePath,"r");
    if (__stream == (FILE *)0x0) {
      pcVar3 = "Configuration file not found.";
    }
    else {
      local_4a0 = &pIM483I->threadperiod;
      local_498 = &pIM483I->bSaveRawData;
      local_490 = &pIM483I->bytedelayus;
      local_488 = &pIM483I->bCheckState;
      local_480 = &pIM483I->CalibrationSpeed;
      local_478 = &pIM483I->CalibrationTime;
      local_470 = &pIM483I->CalibrationHoldTorque;
      local_468 = &pIM483I->CalibrationRunTorque;
      local_460 = &pIM483I->NormalHoldTorque;
      local_458 = &pIM483I->NormalRunTorque;
      local_450 = &pIM483I->ThresholdRval;
      local_448 = &pIM483I->MinAngle;
      local_440 = &pIM483I->MaxAngle;
      while( true ) {
        while (pcVar3 = fgets((char *)&local_5a8,0x100,__stream), 0x24 < local_5a8) {
          if (local_5a8 == 0x25) goto LAB_0011ac48;
          if (((local_5a8 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_5a7 != '/'))
          goto LAB_0011ac60;
        }
        if (local_5a8 != 0x23) break;
LAB_0011ac48:
        if (pcVar3 == (char *)0x0) goto LAB_0011ac65;
      }
      if (local_5a8 == 0x24) goto LAB_0011ac65;
LAB_0011ac60:
      if (pcVar3 == (char *)0x0) {
LAB_0011ac65:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_5a8,"%255s",pIM483I->szDevPath);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_5a8,0x100,__stream), 0x24 < local_5a8) {
          if (local_5a8 == 0x25) goto LAB_0011acd4;
          if (((local_5a8 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_5a7 != '/'))
          goto LAB_0011ace0;
        }
        if (local_5a8 != 0x23) break;
LAB_0011acd4:
        if (pcVar3 == (char *)0x0) goto LAB_0011ace5;
      }
      if (local_5a8 == 0x24) goto LAB_0011ace5;
LAB_0011ace0:
      if (pcVar3 == (char *)0x0) {
LAB_0011ace5:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_5a8,"%d",&pIM483I->BaudRate);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_5a8,0x100,__stream), 0x24 < local_5a8) {
          if (local_5a8 == 0x25) goto LAB_0011ad54;
          if (((local_5a8 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_5a7 != '/'))
          goto LAB_0011ad60;
        }
        if (local_5a8 != 0x23) break;
LAB_0011ad54:
        if (pcVar3 == (char *)0x0) goto LAB_0011ad65;
      }
      if (local_5a8 == 0x24) goto LAB_0011ad65;
LAB_0011ad60:
      if (pcVar3 == (char *)0x0) {
LAB_0011ad65:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_5a8,"%d",&pIM483I->timeout);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_5a8,0x100,__stream), 0x24 < local_5a8) {
          if (local_5a8 == 0x25) goto LAB_0011add4;
          if (((local_5a8 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_5a7 != '/'))
          goto LAB_0011ade0;
        }
        if (local_5a8 != 0x23) break;
LAB_0011add4:
        if (pcVar3 == (char *)0x0) goto LAB_0011ade5;
      }
      if (local_5a8 == 0x24) goto LAB_0011ade5;
LAB_0011ade0:
      if (pcVar3 == (char *)0x0) {
LAB_0011ade5:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_5a8,"%d",local_4a0);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_5a8,0x100,__stream), 0x24 < local_5a8) {
          if (local_5a8 == 0x25) goto LAB_0011ae59;
          if (((local_5a8 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_5a7 != '/'))
          goto LAB_0011ae65;
        }
        if (local_5a8 != 0x23) break;
LAB_0011ae59:
        if (pcVar3 == (char *)0x0) goto LAB_0011ae6a;
      }
      if (local_5a8 == 0x24) goto LAB_0011ae6a;
LAB_0011ae65:
      if (pcVar3 == (char *)0x0) {
LAB_0011ae6a:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_5a8,"%d",local_498);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_5a8,0x100,__stream), 0x24 < local_5a8) {
          if (local_5a8 == 0x25) goto LAB_0011aede;
          if (((local_5a8 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_5a7 != '/'))
          goto LAB_0011aeea;
        }
        if (local_5a8 != 0x23) break;
LAB_0011aede:
        if (pcVar3 == (char *)0x0) goto LAB_0011aeef;
      }
      if (local_5a8 == 0x24) goto LAB_0011aeef;
LAB_0011aeea:
      if (pcVar3 == (char *)0x0) {
LAB_0011aeef:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_5a8,"%d",local_490);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_5a8,0x100,__stream), 0x24 < local_5a8) {
          if (local_5a8 == 0x25) goto LAB_0011af63;
          if (((local_5a8 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_5a7 != '/'))
          goto LAB_0011af6f;
        }
        if (local_5a8 != 0x23) break;
LAB_0011af63:
        if (pcVar3 == (char *)0x0) goto LAB_0011af74;
      }
      if (local_5a8 == 0x24) goto LAB_0011af74;
LAB_0011af6f:
      if (pcVar3 == (char *)0x0) {
LAB_0011af74:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_5a8,"%d",local_488);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_5a8,0x100,__stream), 0x24 < local_5a8) {
          if (local_5a8 == 0x25) goto LAB_0011afe8;
          if (((local_5a8 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_5a7 != '/'))
          goto LAB_0011aff4;
        }
        if (local_5a8 != 0x23) break;
LAB_0011afe8:
        if (pcVar3 == (char *)0x0) goto LAB_0011aff9;
      }
      if (local_5a8 == 0x24) goto LAB_0011aff9;
LAB_0011aff4:
      if (pcVar3 == (char *)0x0) {
LAB_0011aff9:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_5a8,"%d",local_480);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_5a8,0x100,__stream), 0x24 < local_5a8) {
          if (local_5a8 == 0x25) goto LAB_0011b06d;
          if (((local_5a8 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_5a7 != '/'))
          goto LAB_0011b079;
        }
        if (local_5a8 != 0x23) break;
LAB_0011b06d:
        if (pcVar3 == (char *)0x0) goto LAB_0011b07e;
      }
      if (local_5a8 == 0x24) goto LAB_0011b07e;
LAB_0011b079:
      if (pcVar3 == (char *)0x0) {
LAB_0011b07e:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_5a8,"%d",local_478);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_5a8,0x100,__stream), 0x24 < local_5a8) {
          if (local_5a8 == 0x25) goto LAB_0011b0f2;
          if (((local_5a8 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_5a7 != '/'))
          goto LAB_0011b0fe;
        }
        if (local_5a8 != 0x23) break;
LAB_0011b0f2:
        if (pcVar3 == (char *)0x0) goto LAB_0011b103;
      }
      if (local_5a8 == 0x24) goto LAB_0011b103;
LAB_0011b0fe:
      if (pcVar3 == (char *)0x0) {
LAB_0011b103:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_5a8,"%d",local_470);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_5a8,0x100,__stream), 0x24 < local_5a8) {
          if (local_5a8 == 0x25) goto LAB_0011b177;
          if (((local_5a8 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_5a7 != '/'))
          goto LAB_0011b183;
        }
        if (local_5a8 != 0x23) break;
LAB_0011b177:
        if (pcVar3 == (char *)0x0) goto LAB_0011b188;
      }
      if (local_5a8 == 0x24) goto LAB_0011b188;
LAB_0011b183:
      if (pcVar3 == (char *)0x0) {
LAB_0011b188:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_5a8,"%d",local_468);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_5a8,0x100,__stream), 0x24 < local_5a8) {
          if (local_5a8 == 0x25) goto LAB_0011b1fc;
          if (((local_5a8 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_5a7 != '/'))
          goto LAB_0011b208;
        }
        if (local_5a8 != 0x23) break;
LAB_0011b1fc:
        if (pcVar3 == (char *)0x0) goto LAB_0011b20d;
      }
      if (local_5a8 == 0x24) goto LAB_0011b20d;
LAB_0011b208:
      if (pcVar3 == (char *)0x0) {
LAB_0011b20d:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_5a8,"%d",local_460);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_5a8,0x100,__stream), 0x24 < local_5a8) {
          if (local_5a8 == 0x25) goto LAB_0011b281;
          if (((local_5a8 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_5a7 != '/'))
          goto LAB_0011b28d;
        }
        if (local_5a8 != 0x23) break;
LAB_0011b281:
        if (pcVar3 == (char *)0x0) goto LAB_0011b292;
      }
      if (local_5a8 == 0x24) goto LAB_0011b292;
LAB_0011b28d:
      if (pcVar3 == (char *)0x0) {
LAB_0011b292:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_5a8,"%d",local_458);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_5a8,0x100,__stream), 0x24 < local_5a8) {
          if (local_5a8 == 0x25) goto LAB_0011b306;
          if (((local_5a8 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_5a7 != '/'))
          goto LAB_0011b312;
        }
        if (local_5a8 != 0x23) break;
LAB_0011b306:
        if (pcVar3 == (char *)0x0) goto LAB_0011b317;
      }
      if (local_5a8 == 0x24) goto LAB_0011b317;
LAB_0011b312:
      if (pcVar3 == (char *)0x0) {
LAB_0011b317:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_5a8,"%d",local_450);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_5a8,0x100,__stream), 0x24 < local_5a8) {
          if (local_5a8 == 0x25) goto LAB_0011b38b;
          if (((local_5a8 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_5a7 != '/'))
          goto LAB_0011b397;
        }
        if (local_5a8 != 0x23) break;
LAB_0011b38b:
        if (pcVar3 == (char *)0x0) goto LAB_0011b39c;
      }
      if (local_5a8 == 0x24) goto LAB_0011b39c;
LAB_0011b397:
      if (pcVar3 == (char *)0x0) {
LAB_0011b39c:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_5a8,"%lf",local_448);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_5a8,0x100,__stream), 0x24 < local_5a8) {
          if (local_5a8 == 0x25) goto LAB_0011b410;
          if (((local_5a8 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_5a7 != '/'))
          goto LAB_0011b41c;
        }
        if (local_5a8 != 0x23) break;
LAB_0011b410:
        if (pcVar3 == (char *)0x0) goto LAB_0011b421;
      }
      if (local_5a8 == 0x24) goto LAB_0011b421;
LAB_0011b41c:
      if (pcVar3 == (char *)0x0) {
LAB_0011b421:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_5a8,"%lf",local_440);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      iVar1 = fclose(__stream);
      if (iVar1 == 0) goto LAB_0011b471;
      pcVar3 = "fclose() failed.";
    }
    puts(pcVar3);
  }
LAB_0011b471:
  if (pIM483I->threadperiod < 0) {
    puts("Invalid parameter : threadperiod.");
    pIM483I->threadperiod = 0x32;
  }
  iVar1 = pIM483I->CalibrationSpeed;
  iVar7 = -iVar1;
  if (0 < iVar1) {
    iVar7 = iVar1;
  }
  if (iVar7 - 0x4e21U < 0xffffb1f3) {
    puts("Invalid parameter : CalibrationSpeed.");
    pIM483I->CalibrationSpeed = 2000;
  }
  if (600000 < (uint)pIM483I->CalibrationTime) {
    puts("Invalid parameter : CalibrationTime.");
    pIM483I->CalibrationTime = 65000;
  }
  if (100 < (uint)pIM483I->CalibrationHoldTorque) {
    puts("Invalid parameter : CalibrationHoldTorque.");
    pIM483I->CalibrationHoldTorque = 1;
  }
  if (100 < (uint)pIM483I->CalibrationRunTorque) {
    puts("Invalid parameter : CalibrationRunTorque.");
    pIM483I->CalibrationRunTorque = 0x3c;
  }
  if (100 < (uint)pIM483I->NormalHoldTorque) {
    puts("Invalid parameter : NormalHoldTorque.");
    pIM483I->NormalHoldTorque = 1;
  }
  if (100 < (uint)pIM483I->NormalRunTorque) {
    puts("Invalid parameter : NormalRunTorque.");
    pIM483I->NormalRunTorque = 100;
  }
  pIM483I->LastRval = 0x2000004;
  iVar1 = OpenRS232Port(&pIM483I->RS232Port,pIM483I->szDevPath);
  if (iVar1 != 0) {
    puts("Unable to connect to a IM483I.");
    return 1;
  }
  iVar1 = (pIM483I->RS232Port).DevType;
  if (3 < iVar1 - 1U) {
    if ((iVar1 != 0) ||
       (iVar1 = SetOptionsComputerRS232Port
                          ((pIM483I->RS232Port).hDev,pIM483I->BaudRate,'\0',0,'\b','\0',
                           pIM483I->timeout), iVar1 != 0)) goto LAB_0011b6fe;
    tcflush(*(int *)&(pIM483I->RS232Port).hDev,2);
  }
  memset(local_238 + 3,0,0x1fd);
  local_238[0] = ' ';
  local_238[1] = '\r';
  local_238[2] = 0;
  sVar4 = strlen((char *)local_238);
  iVar1 = WriteDataIM483I(pIM483I,local_238,(int)sVar4,pIM483I->bytedelayus);
  if (iVar1 == 0) {
    if ((pIM483I->bSaveRawData != 0) && ((FILE *)pIM483I->pfSaveFile != (FILE *)0x0)) {
      fwrite(local_238,(long)(int)sVar4,1,(FILE *)pIM483I->pfSaveFile);
      fflush((FILE *)pIM483I->pfSaveFile);
    }
    local_438[0].tv_sec = 0;
    local_438[0].tv_nsec = 100000000;
    uVar2 = 0;
    nanosleep(local_438,(timespec *)0x0);
    if (pIM483I->bCheckState == 0) {
LAB_0011b772:
      puts("IM483I connected.");
      return 0;
    }
    memset(local_438,0,0x200);
    do {
      if (uVar2 == 0) {
        uVar5 = 0;
      }
      else {
        uVar5 = (ulong)uVar2;
        if (*(char *)((long)&local_440 + uVar5 + 7) == '#') {
          if ((pIM483I->bSaveRawData != 0) && ((FILE *)pIM483I->pfSaveFile != (FILE *)0x0)) {
            fwrite(local_438,0x1ff,1,(FILE *)pIM483I->pfSaveFile);
            fflush((FILE *)pIM483I->pfSaveFile);
          }
          goto LAB_0011b772;
        }
        if (0x1fe < uVar2) break;
      }
      __buf = (void *)((long)&local_438[0].tv_sec + uVar5);
      iVar1 = (pIM483I->RS232Port).DevType;
      if (iVar1 - 1U < 4) {
        sVar6 = recv((pIM483I->RS232Port).s,__buf,1,0);
        iVar1 = (int)sVar6;
      }
      else {
        if (iVar1 != 0) break;
        sVar6 = read(*(int *)&(pIM483I->RS232Port).hDev,__buf,1);
        iVar1 = (int)sVar6;
      }
      if (iVar1 < 1) break;
      uVar2 = iVar1 + uVar2;
    } while( true );
  }
LAB_0011b6fe:
  puts("Unable to connect to a IM483I.");
  CloseRS232Port(&pIM483I->RS232Port);
  return 1;
}

Assistant:

inline int ConnectIM483I(IM483I* pIM483I, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[256];
	char sendbuf[MAX_NB_BYTES_IM483I];
	int sendbuflen = 0;
	char recvbuf[MAX_NB_BYTES_IM483I];
	int recvbuflen = 0;

	memset(pIM483I->szCfgFilePath, 0, sizeof(pIM483I->szCfgFilePath));
	sprintf(pIM483I->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(pIM483I->szDevPath, 0, sizeof(pIM483I->szDevPath));
		sprintf(pIM483I->szDevPath, "COM1");
		pIM483I->BaudRate = 4800;
		pIM483I->timeout = 1000;
		pIM483I->threadperiod = 50;
		pIM483I->bSaveRawData = 1;
		pIM483I->bytedelayus = -1;
		pIM483I->bCheckState = 0;
		pIM483I->CalibrationSpeed = CALIBRATION_SPEED_IM483I;
		pIM483I->CalibrationTime = CALIBRATION_TIME_IM483I;
		pIM483I->CalibrationHoldTorque = CALIBRATION_HOLD_TORQUE_IM483I;
		pIM483I->CalibrationRunTorque = CALIBRATION_RUN_TORQUE_IM483I;
		pIM483I->NormalHoldTorque = NORMAL_HOLD_TORQUE_IM483I;
		pIM483I->NormalRunTorque = NORMAL_RUN_TORQUE_IM483I;
		pIM483I->ThresholdRval = 0;
		pIM483I->MinAngle = MIN_ANGLE_IM483I;
		pIM483I->MaxAngle = MAX_ANGLE_IM483I;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pIM483I->szDevPath) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pIM483I->BaudRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pIM483I->timeout) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pIM483I->threadperiod) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pIM483I->bSaveRawData) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pIM483I->bytedelayus) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pIM483I->bCheckState) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pIM483I->CalibrationSpeed) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pIM483I->CalibrationTime) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pIM483I->CalibrationHoldTorque) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pIM483I->CalibrationRunTorque) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pIM483I->NormalHoldTorque) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pIM483I->NormalRunTorque) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pIM483I->ThresholdRval) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pIM483I->MinAngle) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pIM483I->MaxAngle) != 1) printf("Invalid configuration file.\n");
			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}

	if (pIM483I->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		pIM483I->threadperiod = 50;
	}
	if ((abs(pIM483I->CalibrationSpeed) < MIN_MOTOR_SPEED_IM483I)||(abs(pIM483I->CalibrationSpeed) > MAX_MOTOR_SPEED_IM483I))
	{
		printf("Invalid parameter : CalibrationSpeed.\n");
		pIM483I->CalibrationSpeed = CALIBRATION_SPEED_IM483I;
	}
	if ((pIM483I->CalibrationTime < 0)||(pIM483I->CalibrationTime > MAX_CALIBRATION_TIME_IM483I))
	{
		printf("Invalid parameter : CalibrationTime.\n");
		pIM483I->CalibrationTime = CALIBRATION_TIME_IM483I;
	}
	if ((pIM483I->CalibrationHoldTorque < 0)||(pIM483I->CalibrationHoldTorque > 100))
	{
		printf("Invalid parameter : CalibrationHoldTorque.\n");
		pIM483I->CalibrationHoldTorque = CALIBRATION_HOLD_TORQUE_IM483I;
	}
	if ((pIM483I->CalibrationRunTorque < 0)||(pIM483I->CalibrationRunTorque > 100))
	{
		printf("Invalid parameter : CalibrationRunTorque.\n");
		pIM483I->CalibrationRunTorque = CALIBRATION_RUN_TORQUE_IM483I;
	}
	if ((pIM483I->NormalHoldTorque < 0)||(pIM483I->NormalHoldTorque > 100))
	{
		printf("Invalid parameter : NormalHoldTorque.\n");
		pIM483I->NormalHoldTorque = NORMAL_HOLD_TORQUE_IM483I;
	}
	if ((pIM483I->NormalRunTorque < 0)||(pIM483I->NormalRunTorque > 100))
	{
		printf("Invalid parameter : NormalRunTorque.\n");
		pIM483I->NormalRunTorque = NORMAL_RUN_TORQUE_IM483I;
	}

	// Used to save raw data, should be handled specifically...
	//pIM483I->pfSaveFile = NULL;

	pIM483I->LastRval = 4*((int)MAX_INDEX_IM483I+2);

	if (OpenRS232Port(&pIM483I->RS232Port, pIM483I->szDevPath) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a IM483I.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(&pIM483I->RS232Port, pIM483I->BaudRate, NOPARITY, FALSE, 8, 
		ONESTOPBIT, (UINT)pIM483I->timeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a IM483I.\n");
		CloseRS232Port(&pIM483I->RS232Port);
		return EXIT_FAILURE;
	}

	// Initialization.
	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sprintf(sendbuf, " \r");
	sendbuflen = (int)strlen(sendbuf);

	if (WriteDataIM483I(pIM483I, (unsigned char*)sendbuf, sendbuflen, pIM483I->bytedelayus) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a IM483I.\n");
		CloseRS232Port(&pIM483I->RS232Port);
		return EXIT_FAILURE;
	}
	if ((pIM483I->bSaveRawData)&&(pIM483I->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pIM483I->pfSaveFile);
		fflush(pIM483I->pfSaveFile);
	}

	mSleep(100);

	if (pIM483I->bCheckState)
	{
		// Should reply 
		// "xxxx xxxx ADVANCED MICRO SYSTEMS, INC\r\nMAX-2000 vX.XXi\r\n#"...
		// e.g.
		// "     4038 ADVANCED MICRO SYSTEMS, INC\r\nMAX-2000 v1.15i\r\n#"...
		// If already initialized
		// " #"?

		// Prepare the buffer that should receive data from the device.
		memset(recvbuf, 0, sizeof(recvbuf));
		recvbuflen = sizeof(recvbuf)-1; // The last character must be a 0 to be a valid string for sscanf.

		if (ReadUntilRS232Port(&pIM483I->RS232Port, (unsigned char*)recvbuf, '#', recvbuflen) != EXIT_SUCCESS)
		{
			printf("Unable to connect to a IM483I.\n");
			CloseRS232Port(&pIM483I->RS232Port);
			return EXIT_FAILURE;
		}
		if ((pIM483I->bSaveRawData)&&(pIM483I->pfSaveFile))
		{
			fwrite(recvbuf, recvbuflen, 1, pIM483I->pfSaveFile);
			fflush(pIM483I->pfSaveFile);
		}

		// Display and analyze received data.
		//printf("Received : \"%s\"\n", recvbuf);
	}

	printf("IM483I connected.\n");

	return EXIT_SUCCESS;
}